

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling_test.cpp
# Opt level: O3

void __thiscall Sampling_Tent_Test::~Sampling_Tent_Test(Sampling_Tent_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Sampling, Tent) {
    // Make sure stratification is preserved at the midpoint of the
    // sampling domain.
    Float dist = std::abs(SampleTent(.501, 1) - SampleTent(.499, 1));
    EXPECT_LT(dist, .01);

    Float rad[] = {Float(1), Float(2.5), Float(.125)};
    RNG rng;
    for (Float radius : rad) {
        auto tent = [&](Float x) { return std::max<Float>(0, 1 - std::abs(x) / radius); };

        auto values = Sample1DFunction(tent, 8192, 64, -radius, radius);
        PiecewiseConstant1D distrib(values, -radius, radius);
        for (int i = 0; i < 100; ++i) {
            Float u = rng.Uniform<Float>();
            Float tx = SampleTent(u, radius);
            Float tp = TentPDF(tx, radius);

            Float dp;
            Float dx = distrib.Sample(u, &dp);
            EXPECT_LT(std::abs(tx - dx), 3e-3)
                << "Closed form = " << tx << ", distrib = " << dx;
            EXPECT_LT(std::abs(tp - dp), 3e-3)
                << "Closed form PDF = " << tp << ", distrib PDF = " << dp;

            auto checkErr = [](Float a, Float b) {
                Float err;
                if (std::min(std::abs(a), std::abs(b)) < 1e-2)
                    err = std::abs(a - b);
                else
                    err = std::abs(2 * (a - b) / (a + b));
                return err > 1e-2;
            };
            EXPECT_FALSE(checkErr(u, InvertTentSample(tx, radius)))
                << "u " << u << " radius " << radius << " x " << tx << " inverse "
                << InvertTentSample(tx, radius);
        }
    }
}